

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLNode::DeepClone(XMLNode *this,XMLDocument *target)

{
  int iVar1;
  undefined4 extraout_var;
  XMLNode *this_00;
  XMLNode *addThis;
  XMLNode *in_RSI;
  XMLNode *in_RDI;
  XMLNode *childClone;
  XMLNode *child;
  XMLNode *clone;
  XMLDocument *local_8;
  
  iVar1 = (*in_RDI->_vptr_XMLNode[0xc])(in_RDI,in_RSI);
  local_8 = (XMLDocument *)CONCAT44(extraout_var,iVar1);
  if (local_8 == (XMLDocument *)0x0) {
    local_8 = (XMLDocument *)0x0;
  }
  else {
    for (this_00 = FirstChild(in_RDI); this_00 != (XMLNode *)0x0; this_00 = NextSibling(this_00)) {
      addThis = DeepClone(in_RSI,local_8);
      InsertEndChild(this_00,addThis);
    }
  }
  return &local_8->super_XMLNode;
}

Assistant:

XMLNode* XMLNode::DeepClone(XMLDocument* target) const
{
	XMLNode* clone = this->ShallowClone(target);
	if (!clone) return 0;

	for (const XMLNode* child = this->FirstChild(); child; child = child->NextSibling()) {
		XMLNode* childClone = child->DeepClone(target);
		TIXMLASSERT(childClone);
		clone->InsertEndChild(childClone);
	}
	return clone;
}